

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O2

void __thiscall SFFile::SetOrder(SFFile *this,int order,int drum,int bank,int program)

{
  SFPerc *pSVar1;
  SFPreset *pSVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  if (drum == 0) {
    lVar3 = 0x15;
    for (lVar5 = 0; lVar5 < this->NumPresets; lVar5 = lVar5 + 1) {
      pSVar2 = this->Presets;
      if (((uint)*(ushort *)(pSVar2->Name + lVar3 + 1) == program) &&
         ((uint)*(ushort *)(pSVar2->Name + lVar3 + 3) == bank)) {
        pSVar2->Name[lVar3] = pSVar2->Name[lVar3] & 0x80U | (byte)order & 0x7f;
      }
      lVar3 = lVar3 + 0x1c;
    }
  }
  else {
    pSVar1 = (this->Percussion).Array;
    uVar4 = 0;
    uVar6 = (ulong)(uint)this->NumPresets;
    if (this->NumPresets < 1) {
      uVar6 = uVar4;
    }
    for (; uVar6 * 0x70 - uVar4 != 0; uVar4 = uVar4 + 0x70) {
      if (((uint)*(byte *)((long)&(pSVar1->Generators).field_0 + uVar4) == bank) &&
         ((uint)*(byte *)((long)&(pSVar1->Generators).field_0 + uVar4 + 1) == program)) {
        (&pSVar1->LoadOrder)[uVar4] = (byte)order;
      }
    }
  }
  return;
}

Assistant:

void SFFile::SetOrder(int order, int drum, int bank, int program)
{
	if (drum)
	{
		for (int i = 0; i < NumPresets; ++i)
		{
			if (Percussion[i].Generators.drumset == bank && Percussion[i].Generators.key == program)
			{
				Percussion[i].LoadOrder = order;
			}
		}
	}
	else
	{
		for (int i = 0; i < NumPresets; ++i)
		{
			if (Presets[i].Program == program && Presets[i].Bank == bank)
			{
				Presets[i].LoadOrder = order;
			}
		}
	}
}